

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

int curve_click(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_scalar *sc,_array *ap,
               t_float basex,t_float basey,int xpix,int ypix,int shift,int alt,int dbl,int doit)

{
  _instancetemplate *p_Var1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  t_pd f;
  t_curve *x;
  int iVar6;
  t_float tVar7;
  t_float tVar8;
  t_float tVar9;
  t_float tVar10;
  uint local_9c;
  int local_98;
  
  if (((ulong)z[3].g_pd & 0x14) != 0) {
    return 0;
  }
  iVar5 = *(int *)&z[0xd].g_next;
  tVar7 = fielddesc_getfloat((_fielddesc *)(z + 0xb),template,data,0);
  iVar6 = 0;
  if ((tVar7 != 0.0) || (NAN(tVar7))) {
    iVar6 = 0;
    if (iVar5 < 1) {
      iVar5 = iVar6;
    }
    f = z[0xe].g_pd;
    local_98 = -1;
    local_9c = 0x7fffffff;
    for (; iVar5 != iVar6; iVar6 = iVar6 + 1) {
      tVar7 = fielddesc_getcoord((_fielddesc *)f,template,data,0);
      tVar8 = glist_xtopixels(glist,(float)(int)tVar7 + basex);
      tVar9 = fielddesc_getcoord((_fielddesc *)&f->c_nmethod,template,data,0);
      tVar10 = glist_ytopixels(glist,(float)(int)tVar9 + basey);
      if ((*(char *)((long)&f->c_name + 1) != '\0') ||
         (*(undefined1 *)((long)&f->c_nmethod + 1) != '\0')) {
        uVar3 = (int)tVar8 - xpix;
        uVar4 = (int)tVar10 - ypix;
        uVar2 = -uVar3;
        if (0 < (int)uVar3) {
          uVar2 = uVar3;
        }
        uVar3 = -uVar4;
        if (0 < (int)uVar4) {
          uVar3 = uVar4;
        }
        if (uVar3 <= uVar2) {
          uVar3 = uVar2;
        }
        if ((int)uVar3 < (int)local_9c) {
          p_Var1 = (pd_maininstance.pd_gui)->i_template;
          *(float *)(p_Var1 + 8) = (float)(int)tVar7;
          *(float *)(p_Var1 + 0x14) = (float)(int)tVar9;
          local_9c = uVar3;
          local_98 = iVar6;
        }
      }
      f = (t_pd)&f->c_symbolmethod;
    }
    if ((int)local_9c < 7) {
      iVar6 = 1;
      if (doit != 0) {
        tVar7 = glist_pixelstox(glist,1.0);
        tVar8 = glist_pixelstox(glist,0.0);
        *(float *)((pd_maininstance.pd_gui)->i_template + 0xc) = tVar7 - tVar8;
        tVar7 = glist_pixelstoy(glist,1.0);
        tVar8 = glist_pixelstoy(glist,0.0);
        p_Var1 = (pd_maininstance.pd_gui)->i_template;
        *(float *)(p_Var1 + 0x18) = tVar7 - tVar8;
        *(int *)(p_Var1 + 4) = 0;
        *(int *)(p_Var1 + 0x10) = 0;
        *(_glist **)(p_Var1 + 0x20) = glist;
        *(t_scalar **)(p_Var1 + 0x28) = sc;
        *(_array **)(p_Var1 + 0x30) = ap;
        *(t_word **)(p_Var1 + 0x38) = data;
        *(int *)p_Var1 = local_98 * 2;
        *(t_template **)(p_Var1 + 0x40) = template;
        if (sc == (t_scalar *)0x0) {
          gpointer_setarray((t_gpointer *)(p_Var1 + 0x48),ap,data);
        }
        else {
          gpointer_setglist((t_gpointer *)(p_Var1 + 0x48),glist,sc);
        }
        glist_grab(glist,z,curve_motionfn,(t_glistkeyfn)0x0,xpix,ypix);
      }
    }
    else {
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

static int curve_click(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_scalar *sc, t_array *ap,
    t_float basex, t_float basey,
    int xpix, int ypix, int shift, int alt, int dbl, int doit)
{
    t_curve *x = (t_curve *)z;
    int i, n = x->x_npoints;
    int bestn = -1;
    int besterror = 0x7fffffff;
    t_fielddesc *f;
    if ((x->x_flags & NOMOUSERUN) || (x->x_flags & NOVERTICES) ||
        !fielddesc_getfloat(&x->x_vis, template, data, 0))
            return (0);
    for (i = 0, f = x->x_vec; i < n; i++, f += 2)
    {
        int xval = fielddesc_getcoord(f, template, data, 0),
            xloc = glist_xtopixels(glist, basex + xval);
        int yval = fielddesc_getcoord(f+1, template, data, 0),
            yloc = glist_ytopixels(glist, basey + yval);
        int xerr = xloc - xpix, yerr = yloc - ypix;
        if (!f->fd_var && !(f+1)->fd_var)
            continue;
        if (xerr < 0)
            xerr = -xerr;
        if (yerr < 0)
            yerr = -yerr;
        if (yerr > xerr)
            xerr = yerr;
        if (xerr < besterror)
        {
            TEMPLATE->curve_motion_xbase = xval;
            TEMPLATE->curve_motion_ybase = yval;
            besterror = xerr;
            bestn = i;
        }
    }
    if (besterror > 6)
        return (0);
    if (doit)
    {
        TEMPLATE->curve_motion_xper = glist_pixelstox(glist, 1)
            - glist_pixelstox(glist, 0);
        TEMPLATE->curve_motion_yper = glist_pixelstoy(glist, 1)
            - glist_pixelstoy(glist, 0);
        TEMPLATE->curve_motion_xcumulative = 0;
        TEMPLATE->curve_motion_ycumulative = 0;
        TEMPLATE->curve_motion_glist = glist;
        TEMPLATE->curve_motion_scalar = sc;
        TEMPLATE->curve_motion_array = ap;
        TEMPLATE->curve_motion_wp = data;
        TEMPLATE->curve_motion_field = 2*bestn;
        TEMPLATE->curve_motion_template = template;
        if (TEMPLATE->curve_motion_scalar)
            gpointer_setglist(&TEMPLATE->curve_motion_gpointer,
                TEMPLATE->curve_motion_glist, TEMPLATE->curve_motion_scalar);
        else gpointer_setarray(&TEMPLATE->curve_motion_gpointer,
                TEMPLATE->curve_motion_array, TEMPLATE->curve_motion_wp);
        glist_grab(glist, z, curve_motionfn, 0, xpix, ypix);
    }
    return (1);
}